

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O0

int google::protobuf::internal::LookUpEnumName
              (EnumEntry *enums,int *sorted_indices,size_t size,int value)

{
  int *piVar1;
  anon_class_16_2_a3bab608_for__M_comp __comp;
  int local_4c [3];
  int *it;
  anon_class_16_2_a3bab608_for__M_comp comparator;
  int value_local;
  size_t size_local;
  int *sorted_indices_local;
  EnumEntry *enums_local;
  
  local_4c[0] = -1;
  __comp.value = value;
  __comp.enums = enums;
  __comp._12_4_ = 0;
  it = (int *)enums;
  comparator.enums._0_4_ = value;
  comparator._12_4_ = value;
  piVar1 = std::
           lower_bound<int_const*,int,google::protobuf::internal::LookUpEnumName(google::protobuf::internal::EnumEntry_const*,int_const*,unsigned_long,int)::__0>
                     (sorted_indices,sorted_indices + size,local_4c,__comp);
  if ((piVar1 == sorted_indices + size) || (enums[*piVar1].value != comparator._12_4_)) {
    enums_local._4_4_ = -1;
  }
  else {
    enums_local._4_4_ = (int)((long)piVar1 - (long)sorted_indices >> 2);
  }
  return enums_local._4_4_;
}

Assistant:

int LookUpEnumName(const EnumEntry* enums, const int* sorted_indices,
                   size_t size, int value) {
  auto comparator = [enums, value](int a, int b) {
    return GetValue(enums, a, value) < GetValue(enums, b, value);
  };
  auto it =
      std::lower_bound(sorted_indices, sorted_indices + size, -1, comparator);
  if (it != sorted_indices + size && enums[*it].value == value) {
    return it - sorted_indices;
  }
  return -1;
}